

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

int token_to_int(IncludeState *state)

{
  uint uVar1;
  char *__src;
  long lVar2;
  int iVar3;
  char *__nptr;
  code *pcStack_20;
  
  if (state->tokenval == TOKEN_INT_LITERAL) {
    uVar1 = state->tokenlen;
    lVar2 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
    __nptr = &stack0xffffffffffffffe8 + lVar2;
    __src = state->token;
    *(undefined8 *)((long)&pcStack_20 + lVar2) = 0x14cbd0;
    memcpy(__nptr,__src,(ulong)uVar1);
    __nptr[uVar1] = '\0';
    *(undefined8 *)((long)&pcStack_20 + lVar2) = 0x14cbdd;
    iVar3 = atoi(__nptr);
    return iVar3;
  }
  pcStack_20 = find_macro_arg;
  __assert_fail("state->tokenval == TOKEN_INT_LITERAL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x2ef,"int token_to_int(IncludeState *)");
}

Assistant:

static int token_to_int(IncludeState *state)
{
    assert(state->tokenval == TOKEN_INT_LITERAL);
    char *buf = (char *) alloca(state->tokenlen+1);
    memcpy(buf, state->token, state->tokenlen);
    buf[state->tokenlen] = '\0';
    return atoi(buf);
}